

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodeclass * NodeContext_FindClassEx(anynode *AnyNode,fourcc_t ClassId,nodemodule *Module)

{
  nodecontext *p_00;
  nodecontext *p;
  nodeclass *Class;
  nodemodule *Module_local;
  fourcc_t ClassId_local;
  anynode *AnyNode_local;
  
  p = (nodecontext *)0x0;
  if (ClassId != 0) {
    if (AnyNode == (anynode *)0x0) {
      __assert_fail("(const void*)(AnyNode)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x125,
                    "const nodeclass *NodeContext_FindClassEx(anynode *, fourcc_t, nodemodule *)");
    }
    p_00 = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
    p = (nodecontext *)FindModuleClass(p_00,ClassId,Module);
    if (p == (nodecontext *)0x0) {
      p = (nodecontext *)NodeContext_FindClass(p_00,ClassId);
    }
  }
  return (nodeclass *)p;
}

Assistant:

NOINLINE const nodeclass* NodeContext_FindClassEx(anynode* AnyNode,fourcc_t ClassId,nodemodule* Module)
{
    const nodeclass* Class = NULL;
    if (ClassId)
    {
        nodecontext* p = Node_Context(AnyNode);

        Class = FindModuleClass(p,ClassId,Module);
        if (!Class)
            Class = NodeContext_FindClass(p,ClassId);
    }
    return Class;
}